

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall
cppnet::Dispatcher::Listen::anon_class_56_4_e8c7a8e2::operator()(anon_class_56_4_e8c7a8e2 *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  Dispatcher *pDVar3;
  int iVar4;
  element_type *peVar5;
  bool bVar6;
  shared_ptr<cppnet::ConnectSocket> connect_sock;
  long *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  long local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  pDVar3 = this->this;
  MakeConnectSocket();
  local_38 = (pDVar3->_event_actions).
             super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30._M_pi =
       (pDVar3->_event_actions).super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_weak_count = (local_30._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_weak_count = (local_30._M_pi)->_M_weak_count + 1;
    }
  }
  local_58[10] = (long)local_38;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0xb),&local_30);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_30._M_pi)->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = (local_30._M_pi)->_M_weak_count;
      (local_30._M_pi)->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*(local_30._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_40._M_pi =
       (pDVar3->_cppnet_base).super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = (local_40._M_pi)->_M_use_count;
    do {
      if (iVar4 == 0) {
        local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_001091e8;
      }
      LOCK();
      iVar2 = (local_40._M_pi)->_M_use_count;
      bVar6 = iVar4 == iVar2;
      if (bVar6) {
        (local_40._M_pi)->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar6);
    if ((local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       ((local_40._M_pi)->_M_use_count != 0)) {
      peVar5 = (pDVar3->_cppnet_base).
               super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      goto LAB_001091ea;
    }
  }
LAB_001091e8:
  peVar5 = (element_type *)0x0;
LAB_001091ea:
  local_58[8] = (long)peVar5;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 9),&local_40);
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  local_58[1] = this->sock;
  std::__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppnet::Dispatcher,void>
            ((__shared_ptr<cppnet::Dispatcher,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2> *)
             &pDVar3->super_enable_shared_from_this<cppnet::Dispatcher>);
  local_58[0xc] = local_28;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0xd),&local_20);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  (**(code **)(*local_58 + 0x10))(local_58,&this->ip,this->port);
  (**(code **)(*local_58 + 0x18))();
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void Dispatcher::Listen(uint64_t sock, const std::string& ip, uint16_t port) {
    auto task = [sock, ip, port, this]() {
        auto connect_sock = MakeConnectSocket();
        connect_sock->SetEventActions(_event_actions);
        connect_sock->SetCppNetBase(_cppnet_base.lock());
        connect_sock->SetSocket(sock);
        connect_sock->SetDispatcher(shared_from_this());

        connect_sock->Bind(ip, port);
        connect_sock->Listen();
    };

    if (std::this_thread::get_id() == _local_thread_id) {
        task();

    } else {
        PostTask(task);
    }
}